

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O1

void __thiscall JUnitTestOutput::writeProperties(JUnitTestOutput *this)

{
  SimpleString SStack_18;
  
  SimpleString::SimpleString(&SStack_18,"<properties>\n");
  (*(this->super_TestOutput)._vptr_TestOutput[0x18])(this,&SStack_18);
  SimpleString::~SimpleString(&SStack_18);
  SimpleString::SimpleString(&SStack_18,"</properties>\n");
  (*(this->super_TestOutput)._vptr_TestOutput[0x18])(this,&SStack_18);
  SimpleString::~SimpleString(&SStack_18);
  return;
}

Assistant:

void JUnitTestOutput::writeProperties()
{
    writeToFile("<properties>\n");
    writeToFile("</properties>\n");
}